

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O1

Raster * rw::d3d8::readAsImage
                   (Stream *stream,int32 width,int32 height,int32 depth,int32 format,int32 numLevels
                   )

{
  bool bVar1;
  bool bVar2;
  uint32 uVar3;
  int32 iVar4;
  Image *this;
  ulong uVar5;
  long lVar6;
  uint8 *puVar7;
  Raster *this_00;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  uint8 *puVar12;
  int iVar13;
  int32 newformat;
  uint8 palette [1024];
  uint local_454;
  int32 local_450;
  int32 local_44c;
  int32 local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint8 local_438 [1032];
  
  local_450 = depth;
  local_44c = height;
  local_448 = width;
  this = Image::create(width,height,0x20);
  Image::allocate(this);
  if (((uint)format >> 0xe & 1) == 0) {
    if (((uint)format >> 0xd & 1) == 0) {
      iVar13 = 0;
      bVar1 = true;
      goto LAB_0011436f;
    }
    iVar13 = 0x100;
    uVar9 = 0x400;
  }
  else {
    iVar13 = 0x10;
    uVar9 = 0x80;
  }
  (*stream->_vptr_Stream[4])(stream,local_438,uVar9);
  bVar1 = false;
LAB_0011436f:
  bVar2 = Raster::formatHasAlpha(format);
  if (!bVar2 && !bVar1) {
    uVar5 = 0;
    do {
      local_438[uVar5 * 4 + 3] = 0xff;
      uVar5 = uVar5 + 1;
    } while (iVar13 + (uint)(iVar13 == 0) != uVar5);
  }
  iVar13 = 0;
  if (numLevels < 1) {
    lVar6 = 0;
    this_00 = (Raster *)0x0;
  }
  else {
    local_440 = format & 7;
    local_444 = format & 0x9000;
    this_00 = (Raster *)0x0;
    lVar6 = 0;
    local_43c = format;
    do {
      uVar3 = Stream::readU32(stream);
      if ((this_00 == (Raster *)0x0) || (iVar4 = Raster::getNumLevels(this_00), iVar13 < iVar4)) {
        if (lVar6 == 0) {
          allocLocation =
               "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 484"
          ;
          lVar6 = (*DAT_00149de8)(uVar3,0x10018);
        }
        (*stream->_vptr_Stream[4])(stream,lVar6,(ulong)uVar3);
        if (this_00 != (Raster *)0x0) {
          Raster::lock(this_00,iVar13,5);
          iVar8 = this_00->width;
          this->width = iVar8;
          this->height = this_00->height;
          this->stride = iVar8 * this->bpp;
        }
        if (((local_43c & 0x6000) != 0) && (0 < this->height)) {
          puVar7 = this->pixels;
          iVar8 = 0;
          lVar10 = lVar6;
          do {
            if (0 < this->width) {
              lVar11 = 0;
              puVar12 = puVar7;
              do {
                *puVar12 = local_438[(ulong)*(byte *)(lVar10 + lVar11) * 4];
                puVar12[1] = local_438[(ulong)*(byte *)(lVar10 + lVar11) * 4 + 1];
                puVar12[2] = local_438[(ulong)*(byte *)(lVar10 + lVar11) * 4 + 2];
                puVar12[3] = local_438[(ulong)*(byte *)(lVar10 + lVar11) * 4 + 3];
                puVar12 = puVar12 + this->bpp;
                lVar11 = lVar11 + 1;
              } while ((int)lVar11 < this->width);
              lVar10 = lVar10 + lVar11;
            }
            puVar7 = puVar7 + this->stride;
            iVar8 = iVar8 + 1;
          } while (iVar8 < this->height);
        }
        if (this_00 == (Raster *)0x0) {
          Raster::imageFindRasterFormat
                    (this,local_440,&local_448,&local_44c,&local_450,(int32 *)&local_454,0);
          local_454 = local_454 | local_444;
          this_00 = Raster::create(local_448,local_44c,local_450,local_454,0);
          Raster::lock(this_00,iVar13,5);
        }
        Raster::setFromImage(this_00,this,0);
        Raster::unlock(this_00,iVar13);
      }
      else {
        (*stream->_vptr_Stream[5])(stream,(ulong)uVar3,1);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != numLevels);
  }
  (*DAT_00149de0)(lVar6);
  Image::destroy(this);
  return this_00;
}

Assistant:

Raster*
readAsImage(Stream *stream, int32 width, int32 height, int32 depth, int32 format, int32 numLevels)
{
	uint8 palette[256*4];
	int32 pallen = 0;
	uint8 *data = nil;

	Image *img = Image::create(width, height, 32);
	img->allocate();

	if(format & Raster::PAL4){
		pallen = 16;
		stream->read8(palette, 4*32);
	}else if(format & Raster::PAL8){
		pallen = 256;
		stream->read8(palette, 4*256);
	}
	if(!Raster::formatHasAlpha(format))
		for(int32 i = 0; i < pallen; i++)
			palette[i*4+3] = 0xFF;

	Raster *ras = nil;

	for(int i = 0; i < numLevels; i++){
		uint32 size = stream->readU32();

		// don't read levels that don't exist
		if(ras && i >= ras->getNumLevels()){
			stream->seek(size);
			continue;
		}

		// one allocation is enough, first level is largest
		if(data == nil)
			data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_IMAGE);
		stream->read8(data, size);

		if(ras){
			ras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
			img->width = ras->width;
			img->height = ras->height;
			img->stride = img->width*img->bpp;
		}

		if(format & (Raster::PAL4 | Raster::PAL8)){
			uint8 *idx = data;
			uint8 *pixels = img->pixels;
			for(int y = 0; y < img->height; y++){
				uint8 *line = pixels;
				for(int x = 0; x < img->width; x++){
					line[0] = palette[*idx*4+0];
					line[1] = palette[*idx*4+1];
					line[2] = palette[*idx*4+2];
					line[3] = palette[*idx*4+3];
					line += img->bpp;
					idx++;
				}
				pixels += img->stride;
			}
		}

		if(ras == nil){
			// Important to have filled the image with data
			int32 newformat;
			Raster::imageFindRasterFormat(img, format&7, &width, &height, &depth, &newformat);
			newformat |= format & (Raster::MIPMAP | Raster::AUTOMIPMAP);
			ras = Raster::create(width, height, depth, newformat);
			ras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		}

		ras->setFromImage(img);
		ras->unlock(i);
	}

	rwFree(data);
	img->destroy();
	return ras;
}